

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::Combo(char *label,int *current_item,_func_bool_void_ptr_int_char_ptr_ptr *items_getter,
                 void *data,int items_count,int popup_max_height_in_items)

{
  char *label_00;
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  float _y;
  ImVec2 local_78;
  char *local_70;
  char *item_text;
  int local_60;
  bool item_selected;
  int i;
  bool value_changed;
  ImVec2 local_50;
  char *local_48;
  char *preview_value;
  ImGuiContext *g;
  int popup_max_height_in_items_local;
  int items_count_local;
  void *data_local;
  _func_bool_void_ptr_int_char_ptr_ptr *items_getter_local;
  int *current_item_local;
  char *label_local;
  
  preview_value = &GImGui->Initialized;
  local_48 = (char *)0x0;
  g._0_4_ = popup_max_height_in_items;
  g._4_4_ = items_count;
  _popup_max_height_in_items_local = data;
  data_local = items_getter;
  items_getter_local = (_func_bool_void_ptr_int_char_ptr_ptr *)current_item;
  current_item_local = (int *)label;
  if ((-1 < *current_item) && (*current_item < items_count)) {
    (*items_getter)(data,*current_item,&local_48);
  }
  if (((int)g != -1) && ((*(uint *)(preview_value + 0x1b10) & 0x10) == 0)) {
    ImVec2::ImVec2(&local_50,0.0,0.0);
    _y = CalcMaxPopupHeightFromItemCount((int)g);
    ImVec2::ImVec2((ImVec2 *)&i,3.4028235e+38,_y);
    SetNextWindowSizeConstraints(&local_50,(ImVec2 *)&i,(ImGuiSizeCallback)0x0,(void *)0x0);
  }
  bVar2 = BeginCombo((char *)current_item_local,local_48,0);
  if (bVar2) {
    item_selected = false;
    for (local_60 = 0; local_60 < g._4_4_; local_60 = local_60 + 1) {
      PushID((void *)(long)local_60);
      item_text._7_1_ = local_60 == *(int *)items_getter_local;
      uVar3 = (*(code *)data_local)(_popup_max_height_in_items_local,local_60,&local_70);
      bVar1 = item_text._7_1_;
      if ((uVar3 & 1) == 0) {
        local_70 = "*Unknown item*";
      }
      label_00 = local_70;
      ImVec2::ImVec2(&local_78,0.0,0.0);
      bVar2 = Selectable(label_00,(bool)(bVar1 & 1),0,&local_78);
      if (bVar2) {
        item_selected = true;
        *(int *)items_getter_local = local_60;
      }
      if ((item_text._7_1_ & 1) != 0) {
        SetItemDefaultFocus();
      }
      PopID();
    }
    EndCombo();
    label_local._7_1_ = (bool)(item_selected & 1);
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, bool (*items_getter)(void*, int, const char**), void* data, int items_count, int popup_max_height_in_items)
{
    ImGuiContext& g = *GImGui;

    // Call the getter to obtain the preview string which is a parameter to BeginCombo()
    const char* preview_value = NULL;
    if (*current_item >= 0 && *current_item < items_count)
        items_getter(data, *current_item, &preview_value);

    // The old Combo() API exposed "popup_max_height_in_items". The new more general BeginCombo() API doesn't have/need it, but we emulate it here.
    if (popup_max_height_in_items != -1 && !(g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint))
        SetNextWindowSizeConstraints(ImVec2(0,0), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));

    if (!BeginCombo(label, preview_value, ImGuiComboFlags_None))
        return false;

    // Display items
    // FIXME-OPT: Use clipper (but we need to disable it on the appearing frame to make sure our call to SetItemDefaultFocus() is processed)
    bool value_changed = false;
    for (int i = 0; i < items_count; i++)
    {
        PushID((void*)(intptr_t)i);
        const bool item_selected = (i == *current_item);
        const char* item_text;
        if (!items_getter(data, i, &item_text))
            item_text = "*Unknown item*";
        if (Selectable(item_text, item_selected))
        {
            value_changed = true;
            *current_item = i;
        }
        if (item_selected)
            SetItemDefaultFocus();
        PopID();
    }

    EndCombo();
    return value_changed;
}